

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void __thiscall cmState::RemoveBuiltinCommand(cmState *this,string *name)

{
  size_t __n;
  int iVar1;
  string local_38;
  
  cmsys::SystemTools::LowerCase(&local_38,name);
  __n = name->_M_string_length;
  if (__n == local_38._M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp((name->_M_dataplus)._M_p,local_38._M_dataplus._M_p,__n);
      if (iVar1 != 0) goto LAB_002dce45;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&(this->BuiltinCommands)._M_h,name);
    return;
  }
LAB_002dce45:
  __assert_fail("name == cmSystemTools::LowerCase(name)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                ,0x22c,"void cmState::RemoveBuiltinCommand(const std::string &)");
}

Assistant:

void cmState::RemoveBuiltinCommand(std::string const& name)
{
  assert(name == cmSystemTools::LowerCase(name));
  this->BuiltinCommands.erase(name);
}